

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

void __thiscall
mini_bus::MiniBusClient::MiniBusClient
          (MiniBusClient *this,shared_ptr<mini_bus::ConnectionInfo> *info)

{
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_30 [3];
  shared_ptr<mini_bus::ConnectionInfo> *local_18;
  shared_ptr<mini_bus::ConnectionInfo> *info_local;
  MiniBusClient *this_local;
  
  local_18 = info;
  info_local = (shared_ptr<mini_bus::ConnectionInfo> *)this;
  std::atomic<bool>::atomic(&this->is_running,true);
  std::shared_ptr<mini_bus::ConnectionInfo>::shared_ptr(&this->info,info);
  std::random_device::random_device(&this->rd);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&this->dist);
  std::mutex::mutex(&this->mtx);
  std::
  map<unsigned_long,_std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->reqmap);
  std::
  map<unsigned_long,_std::function<void_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<void_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)>_>_>_>
  ::map(&this->evtmap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(std::variant<std::basic_string_view<char,_std::char_traits<char>_>,_std::runtime_error>)>)>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(std::variant<std::basic_string_view<char,_std::char_traits<char>_>,_std::runtime_error>)>)>_>_>_>
  ::map(&this->fnmap);
  std::
  optional<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::optional(&this->socket);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)&this->work_thread);
  std::
  make_unique<std::thread,mini_bus::MiniBusClient::MiniBusClient(std::shared_ptr<mini_bus::ConnectionInfo>)::_lambda()_1_>
            ((type *)local_30);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
            (&this->work_thread,local_30);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(local_30);
  return;
}

Assistant:

inline MiniBusClient(std::shared_ptr<ConnectionInfo> info) : info(std::move(info)) {
    work_thread = std::make_unique<std::thread>([this] { worker(); });
  }